

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

TARGET_HANDLE target_create(void)

{
  TARGET_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (TARGET_HANDLE)malloc(8);
  if (__ptr != (TARGET_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x29);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (TARGET_HANDLE)0x0;
}

Assistant:

TARGET_HANDLE target_create(void)
{
    TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)malloc(sizeof(TARGET_INSTANCE));
    if (target_instance != NULL)
    {
        target_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(41);
        if (target_instance->composite_value == NULL)
        {
            free(target_instance);
            target_instance = NULL;
        }
    }

    return target_instance;
}